

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementText.cpp
# Opt level: O2

void __thiscall Rml::ElementText::GetRML(ElementText *this,String *content)

{
  String local_30;
  
  StringUtilities::EncodeRml(&local_30,&this->text);
  ::std::__cxx11::string::append((string *)content);
  ::std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void ElementText::GetRML(String& content)
{
	content += StringUtilities::EncodeRml(text);
}